

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::MatchLiteralNode::TransferPass1
          (MatchLiteralNode *this,Compiler *compiler,Char *litbuf)

{
  Type *pTVar1;
  uint uVar2;
  Program *pPVar3;
  char16_t *pcVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  pPVar3 = compiler->program;
  uVar2 = (pPVar3->rep).insts.litbufLen;
  if (this->isEquivClass == false) {
    uVar11 = this->length;
    uVar12 = (ulong)uVar11;
    uVar9 = uVar2;
    if (uVar12 != 0) {
      uVar9 = this->offset;
      pcVar4 = (pPVar3->rep).insts.litbuf.ptr;
      uVar10 = uVar2;
      do {
        pcVar4[uVar10] = litbuf[uVar9];
        uVar10 = uVar10 + 1;
        uVar9 = uVar9 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      uVar9 = (pPVar3->rep).insts.litbufLen;
    }
    (pPVar3->rep).insts.litbufLen = uVar11 + uVar9;
  }
  else {
    if ((pPVar3->flags & IgnoreCaseRegexFlag) == NoRegexFlags) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x345,"((compiler.program->flags & IgnoreCaseRegexFlag) != 0)",
                         "(compiler.program->flags & IgnoreCaseRegexFlag) != 0");
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    if (this->length == 0) {
      iVar7 = 0;
    }
    else {
      uVar11 = 0;
      uVar12 = 0;
      do {
        StandardChars<char16_t>::ToEquivs
                  (compiler->standardChars,compiler->program->flags >> 3 & CaseFolding,
                   litbuf[this->offset + (int)uVar12],
                   (compiler->program->rep).insts.litbuf.ptr + (ulong)uVar2 + (ulong)uVar11);
        uVar12 = uVar12 + 1;
        uVar11 = uVar11 + 4;
      } while (uVar12 < this->length);
      iVar7 = this->length << 2;
    }
    pTVar1 = &(compiler->program->rep).insts.litbufLen;
    *pTVar1 = *pTVar1 + iVar7;
  }
  this->offset = uVar2;
  return;
}

Assistant:

void MatchLiteralNode::TransferPass1(Compiler& compiler, const Char* litbuf)
    {
        CharCount nextLit = compiler.program->rep.insts.litbufLen;
        if (isEquivClass)
        {
            Assert((compiler.program->flags & IgnoreCaseRegexFlag) != 0);
            // Expand literal according to character equivalence classes
            for (CharCount i = 0; i < length; i++)
            {
                compiler.standardChars->ToEquivs(
                    compiler.program->GetCaseMappingSource(),
                    litbuf[offset + i],
                    compiler.program->rep.insts.litbuf + nextLit + i * CaseInsensitive::EquivClassSize);
            }
            compiler.program->rep.insts.litbufLen += length * CaseInsensitive::EquivClassSize;
        }
        else
        {
            for (CharCount i = 0; i < length; i++)
                compiler.program->rep.insts.litbuf[nextLit + i] = litbuf[offset + i];
            compiler.program->rep.insts.litbufLen += length;
        }
        offset = nextLit;
    }